

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# master_link.cpp
# Opt level: O3

bool __thiscall
miniros::MasterLink::getTopics
          (MasterLink *this,vector<miniros::TopicInfo,_std::allocator<miniros::TopicInfo>_> *topics)

{
  pointer pcVar1;
  Error EVar2;
  int iVar3;
  string *value;
  XmlRpcValue *pXVar4;
  ulong uVar5;
  RpcValue args;
  RpcValue payload;
  RpcValue result;
  string subgraph;
  XmlRpcValue local_108;
  TopicInfo local_f8;
  vector<miniros::TopicInfo,_std::allocator<miniros::TopicInfo>_> *local_b8;
  RpcValue local_b0;
  RpcValue local_a0;
  string local_90;
  string local_70;
  string local_50;
  
  local_108._type = TypeInvalid;
  local_108._value.asDouble = 0.0;
  local_a0._type = TypeInvalid;
  local_a0._value.asDouble = 0.0;
  local_b0._type = TypeInvalid;
  local_b0._value.asDouble = 0.0;
  local_b8 = topics;
  value = this_node::getName_abi_cxx11_();
  XmlRpc::XmlRpcValue::XmlRpcValue((XmlRpcValue *)&local_f8,value);
  pXVar4 = XmlRpc::XmlRpcValue::operator[](&local_108,0);
  XmlRpc::XmlRpcValue::operator=(pXVar4,(XmlRpcValue *)&local_f8);
  XmlRpc::XmlRpcValue::invalidate((XmlRpcValue *)&local_f8);
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"");
  XmlRpc::XmlRpcValue::XmlRpcValue((XmlRpcValue *)&local_f8,&local_50);
  pXVar4 = XmlRpc::XmlRpcValue::operator[](&local_108,1);
  XmlRpc::XmlRpcValue::operator=(pXVar4,(XmlRpcValue *)&local_f8);
  XmlRpc::XmlRpcValue::invalidate((XmlRpcValue *)&local_f8);
  local_f8.name._M_dataplus._M_p = (pointer)&local_f8.name.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"getPublishedTopics","");
  EVar2 = execute(this,&local_f8.name,&local_108,&local_a0,&local_b0,true);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8.name._M_dataplus._M_p != &local_f8.name.field_2) {
    operator_delete(local_f8.name._M_dataplus._M_p,local_f8.name.field_2._M_allocated_capacity + 1);
  }
  if (EVar2.code == Ok) {
    std::vector<miniros::TopicInfo,_std::allocator<miniros::TopicInfo>_>::_M_erase_at_end
              (local_b8,*(pointer *)local_b8);
    uVar5 = 0;
    while( true ) {
      iVar3 = XmlRpc::XmlRpcValue::size(&local_b0);
      if ((ulong)(long)iVar3 <= uVar5) break;
      pXVar4 = XmlRpc::XmlRpcValue::operator[](&local_b0,(int)uVar5);
      pXVar4 = XmlRpc::XmlRpcValue::operator[](pXVar4,0);
      XmlRpc::XmlRpcValue::assertTypeOrInvalid(pXVar4,TypeString);
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      pcVar1 = (((pXVar4->_value).asBinary)->super__Vector_base<char,_std::allocator<char>_>).
               _M_impl.super__Vector_impl_data._M_start;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_70,pcVar1,
                 (((pXVar4->_value).asBinary)->super__Vector_base<char,_std::allocator<char>_>).
                 _M_impl.super__Vector_impl_data._M_finish + (long)pcVar1);
      pXVar4 = XmlRpc::XmlRpcValue::operator[](&local_b0,(int)uVar5);
      pXVar4 = XmlRpc::XmlRpcValue::operator[](pXVar4,1);
      XmlRpc::XmlRpcValue::assertTypeOrInvalid(pXVar4,TypeString);
      local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
      pcVar1 = (((pXVar4->_value).asBinary)->super__Vector_base<char,_std::allocator<char>_>).
               _M_impl.super__Vector_impl_data._M_start;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_90,pcVar1,
                 (((pXVar4->_value).asBinary)->super__Vector_base<char,_std::allocator<char>_>).
                 _M_impl.super__Vector_impl_data._M_finish + (long)pcVar1);
      TopicInfo::TopicInfo(&local_f8,&local_70,&local_90);
      std::vector<miniros::TopicInfo,_std::allocator<miniros::TopicInfo>_>::
      emplace_back<miniros::TopicInfo>(local_b8,&local_f8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f8.datatype._M_dataplus._M_p != &local_f8.datatype.field_2) {
        operator_delete(local_f8.datatype._M_dataplus._M_p,
                        local_f8.datatype.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f8.name._M_dataplus._M_p != &local_f8.name.field_2) {
        operator_delete(local_f8.name._M_dataplus._M_p,
                        local_f8.name.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
      }
      uVar5 = uVar5 + 1;
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  XmlRpc::XmlRpcValue::invalidate(&local_b0);
  XmlRpc::XmlRpcValue::invalidate(&local_a0);
  XmlRpc::XmlRpcValue::invalidate(&local_108);
  return EVar2.code == Ok;
}

Assistant:

bool MasterLink::getTopics(std::vector<TopicInfo>& topics) const
{
  RpcValue args, result, payload;
  args[0] = this_node::getName();
  const std::string subgraph = "";
  args[1] = subgraph;

  if (!execute("getPublishedTopics", args, result, payload, true)) {
    return false;
  }

  topics.clear();
  for (size_t i = 0; i < payload.size(); i++) {
    topics.push_back(TopicInfo(std::string(payload[i][0]), std::string(payload[i][1])));
  }

  return true;
}